

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RollbackAll(sqlite3 *db,int tripCode)

{
  bool bVar1;
  int iVar2;
  sqlite3 *in_RDI;
  Btree *unaff_retaddr;
  Btree *p;
  int schemaChange;
  int inTrans;
  int i;
  sqlite3 *in_stack_ffffffffffffffe0;
  int local_10;
  
  bVar1 = false;
  sqlite3BeginBenignMalloc();
  sqlite3BtreeEnterAll(in_stack_ffffffffffffffe0);
  for (local_10 = 0; local_10 < in_RDI->nDb; local_10 = local_10 + 1) {
    in_stack_ffffffffffffffe0 = (sqlite3 *)in_RDI->aDb[local_10].pBt;
    if (in_stack_ffffffffffffffe0 != (sqlite3 *)0x0) {
      iVar2 = sqlite3BtreeIsInTrans((Btree *)in_stack_ffffffffffffffe0);
      if (iVar2 != 0) {
        bVar1 = true;
      }
      sqlite3BtreeRollback(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
  }
  sqlite3VtabRollback((sqlite3 *)0x139976);
  sqlite3EndBenignMalloc();
  if (((in_RDI->flags & 2U) != 0) && ((in_RDI->init).busy == '\0')) {
    sqlite3ExpirePreparedStatements(in_RDI);
    sqlite3ResetAllSchemasOfConnection(in_stack_ffffffffffffffe0);
  }
  sqlite3BtreeLeaveAll(in_stack_ffffffffffffffe0);
  in_RDI->nDeferredCons = 0;
  in_RDI->nDeferredImmCons = 0;
  in_RDI->flags = in_RDI->flags & 0xfeffffff;
  if ((in_RDI->xRollbackCallback != (_func_void_void_ptr *)0x0) &&
     ((bVar1 || (in_RDI->autoCommit == '\0')))) {
    (*in_RDI->xRollbackCallback)(in_RDI->pRollbackArg);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RollbackAll(sqlite3 *db, int tripCode){
  int i;
  int inTrans = 0;
  int schemaChange;
  assert( sqlite3_mutex_held(db->mutex) );
  sqlite3BeginBenignMalloc();

  /* Obtain all b-tree mutexes before making any calls to BtreeRollback(). 
  ** This is important in case the transaction being rolled back has
  ** modified the database schema. If the b-tree mutexes are not taken
  ** here, then another shared-cache connection might sneak in between
  ** the database rollback and schema reset, which can cause false
  ** corruption reports in some cases.  */
  sqlite3BtreeEnterAll(db);
  schemaChange = (db->flags & SQLITE_InternChanges)!=0 && db->init.busy==0;

  for(i=0; i<db->nDb; i++){
    Btree *p = db->aDb[i].pBt;
    if( p ){
      if( sqlite3BtreeIsInTrans(p) ){
        inTrans = 1;
      }
      sqlite3BtreeRollback(p, tripCode, !schemaChange);
    }
  }
  sqlite3VtabRollback(db);
  sqlite3EndBenignMalloc();

  if( (db->flags&SQLITE_InternChanges)!=0 && db->init.busy==0 ){
    sqlite3ExpirePreparedStatements(db);
    sqlite3ResetAllSchemasOfConnection(db);
  }
  sqlite3BtreeLeaveAll(db);

  /* Any deferred constraint violations have now been resolved. */
  db->nDeferredCons = 0;
  db->nDeferredImmCons = 0;
  db->flags &= ~SQLITE_DeferFKs;

  /* If one has been configured, invoke the rollback-hook callback */
  if( db->xRollbackCallback && (inTrans || !db->autoCommit) ){
    db->xRollbackCallback(db->pRollbackArg);
  }
}